

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_mod_int(mbedtls_mpi_uint *r,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (b == 0) {
    iVar1 = -0xc;
  }
  else if (b < 0) {
    iVar1 = -10;
  }
  else {
    iVar1 = 0;
    if ((b == 1) || (uVar3 = (ulong)A->n, uVar3 == 0)) {
      uVar3 = 0;
    }
    else if (b == 2) {
      uVar3 = (ulong)((uint)*A->p & 1);
    }
    else {
      uVar2 = 0;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        uVar2 = (A->p[uVar3] & 0xffffffff | (uVar2 << 0x20 | A->p[uVar3] >> 0x20) % (ulong)b << 0x20
                ) % (ulong)b;
      }
      uVar3 = b - uVar2;
      if (uVar2 == 0) {
        uVar3 = uVar2;
      }
      if (-1 < A->s) {
        uVar3 = uVar2;
      }
    }
    *r = uVar3;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_mod_int(mbedtls_mpi_uint *r, const mbedtls_mpi *A, mbedtls_mpi_sint b)
{
    size_t i;
    mbedtls_mpi_uint x, y, z;

    if (b == 0) {
        return MBEDTLS_ERR_MPI_DIVISION_BY_ZERO;
    }

    if (b < 0) {
        return MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
    }

    /*
     * handle trivial cases
     */
    if (b == 1 || A->n == 0) {
        *r = 0;
        return 0;
    }

    if (b == 2) {
        *r = A->p[0] & 1;
        return 0;
    }

    /*
     * general case
     */
    for (i = A->n, y = 0; i > 0; i--) {
        x  = A->p[i - 1];
        y  = (y << biH) | (x >> biH);
        z  = y / b;
        y -= z * b;

        x <<= biH;
        y  = (y << biH) | (x >> biH);
        z  = y / b;
        y -= z * b;
    }

    /*
     * If A is negative, then the current y represents a negative value.
     * Flipping it to the positive side.
     */
    if (A->s < 0 && y != 0) {
        y = b - y;
    }

    *r = y;

    return 0;
}